

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_AB.dlopen.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  code *pcVar5;
  
  lVar1 = dlopen(libB,1);
  if (lVar1 == 0) {
    main_cold_4();
LAB_001012f5:
    main_cold_3();
  }
  else {
    lVar2 = dlopen(libA,1);
    if (lVar2 == 0) goto LAB_001012f5;
    pcVar3 = (code *)dlsym(lVar2,"call_A");
    lVar4 = dlerror();
    if (lVar4 == 0) {
      pcVar5 = (code *)dlsym(lVar1,"call_B");
      lVar4 = dlerror();
      if (lVar4 == 0) {
        printf("  main_AB->");
        (*pcVar3)();
        printf("  main_AB->");
        (*pcVar5)();
        dlclose(lVar1);
        dlclose(lVar2);
        return 0;
      }
      goto LAB_00101302;
    }
  }
  main_cold_1();
LAB_00101302:
  main_cold_2();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
  (void)argc;
  (void)argv;

  void *handle_A;
  void *handle_B;
  int (*call_A)(void);
  int (*call_B)(void);
  char *error;

  handle_B = dlopen(libB, DLOPEN_FLAGS);
  if(handle_B == NULL) {
    fprintf(stderr, "%s\n", dlerror());
    exit(EXIT_FAILURE);
  }

  handle_A = dlopen(libA, DLOPEN_FLAGS);
  if(handle_A == NULL) {
    fprintf(stderr, "%s\n", dlerror());
    exit(EXIT_FAILURE);
  }


  call_A = dlsym(handle_A, "call_A");
  error = dlerror();
  if(error != NULL) {
    fprintf(stderr, "%s\n", error);
    exit(EXIT_FAILURE);
  }
  call_B = dlsym(handle_B, "call_B");
  error = dlerror();
  if(error != NULL) {
    fprintf(stderr, "%s\n", error);
    exit(EXIT_FAILURE);
  }

  printf("  main_AB->");
  call_A();
  printf("  main_AB->");
  call_B();

  dlclose(handle_B);
  dlclose(handle_A);

  return 0;
}